

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

void __thiscall
snappy::SnappyDecompressor::DecompressAllTags<snappy::SnappyArrayWriter>
          (SnappyDecompressor *this,SnappyArrayWriter *writer)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  char *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  undefined4 extraout_var;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  uint *__src;
  size_t n;
  ulong local_38;
  
  __src = (uint *)this->ip_;
  if ((long)this->ip_limit_ - (long)__src < 5) {
    bVar5 = RefillTag(this);
    if (!bVar5) {
      return;
    }
    __src = (uint *)this->ip_;
  }
  do {
    puVar1 = (uint *)((long)__src + 1);
    bVar2 = (byte)*__src;
    if ((bVar2 & 3) == 0) {
      uVar9 = (ulong)(bVar2 >> 2) + 1;
      if (((bVar2 < 0x40) && (0x14 < (ulong)((long)this->ip_limit_ - (long)puVar1))) &&
         (pcVar4 = writer->op_, 0xf < (ulong)((long)writer->op_limit_ - (long)pcVar4))) {
        *(undefined8 *)pcVar4 = *(undefined8 *)((long)__src + 1);
        *(undefined8 *)(pcVar4 + 8) = *(undefined8 *)((long)__src + 9);
        writer->op_ = pcVar4 + uVar9;
        __src = (uint *)((long)puVar1 + uVar9);
        cVar6 = '\x03';
      }
      else {
        __src = puVar1;
        if (0xec < bVar2) {
          uVar9 = (ulong)((*(uint *)(char_table + uVar9 * 4 + 0x110) & *puVar1) + 1);
          __src = (uint *)((long)puVar1 + ((ulong)(bVar2 >> 2) - 0x3b));
        }
        uVar10 = (long)this->ip_limit_ - (long)__src;
        if (uVar10 < uVar9) {
          do {
            pcVar4 = writer->op_;
            cVar6 = '\x01';
            if ((ulong)((long)writer->op_limit_ - (long)pcVar4) < uVar10) goto LAB_00149de2;
            memcpy(pcVar4,__src,uVar10);
            writer->op_ = pcVar4 + uVar10;
            (*this->reader_->_vptr_Source[4])(this->reader_,(ulong)this->peeked_);
            iVar7 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
            __src = (uint *)CONCAT44(extraout_var,iVar7);
            this->peeked_ = (uint32)local_38;
            if (local_38 == 0) goto LAB_00149eb0;
            uVar9 = uVar9 - uVar10;
            this->ip_limit_ = (char *)((long)__src + local_38);
            uVar10 = local_38;
          } while (local_38 < uVar9);
        }
        pcVar4 = writer->op_;
        if ((ulong)((long)writer->op_limit_ - (long)pcVar4) < uVar9) {
LAB_00149de2:
          cVar6 = '\x01';
        }
        else {
          memcpy(pcVar4,__src,uVar9);
          writer->op_ = pcVar4 + uVar9;
          __src = (uint *)((long)__src + uVar9);
          cVar6 = '\0';
          if ((long)this->ip_limit_ - (long)__src < 5) {
            this->ip_ = (char *)__src;
            bVar5 = RefillTag(this);
            if (bVar5) {
              __src = (uint *)this->ip_;
            }
            cVar6 = !bVar5;
          }
        }
      }
LAB_00149eb0:
      if (cVar6 == '\0') goto LAB_00149f16;
    }
    else {
      pcVar4 = writer->op_;
      if (pcVar4 < writer->base_) {
        __assert_fail("op >= base_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                      ,0x4b3,"bool snappy::SnappyArrayWriter::AppendFromSelf(size_t, size_t)");
      }
      uVar3 = *(ushort *)(char_table + (ulong)bVar2 * 2);
      __src = (uint *)((long)puVar1 + (ulong)(uVar3 >> 0xb));
      uVar8 = (uVar3 & 0x700) + (*(uint *)(wordmask + (ulong)(uVar3 >> 0xb) * 4) & *puVar1);
      uVar9 = (ulong)uVar8;
      if (uVar9 - 1 < (ulong)((long)pcVar4 - (long)writer->base_)) {
        uVar10 = (ulong)(uVar3 & 0xff);
        uVar11 = (long)writer->op_limit_ - (long)pcVar4;
        if ((uVar11 < 0x10 || 0x10 < (uVar3 & 0xff)) || uVar8 < 8) {
          if (uVar11 < uVar10 + 10) {
            if (uVar11 < uVar10) goto LAB_00149dfc;
            if ((uVar3 & 0xff) == 0) {
              __assert_fail("len > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/snappy/snappy.cc"
                            ,0x68,"void snappy::IncrementalCopy(const char *, char *, ssize_t)");
            }
            lVar13 = uVar10 + 1;
            pcVar15 = pcVar4;
            do {
              *pcVar15 = pcVar15[-uVar9];
              pcVar15 = pcVar15 + 1;
              lVar13 = lVar13 + -1;
            } while (1 < lVar13);
          }
          else {
            pcVar12 = pcVar4 + -uVar9;
            uVar11 = uVar10;
            pcVar15 = pcVar4;
            if (uVar8 < 8) {
              do {
                *(undefined8 *)pcVar15 = *(undefined8 *)pcVar12;
                uVar11 = uVar11 - uVar9;
                pcVar15 = pcVar15 + uVar9;
                uVar9 = (long)pcVar15 - (long)pcVar12;
              } while ((long)uVar9 < 8);
            }
            if (0 < (long)uVar11) {
              lVar14 = uVar11 + 8;
              lVar13 = 0;
              do {
                *(undefined8 *)(pcVar15 + lVar13) = *(undefined8 *)(pcVar12 + lVar13);
                lVar14 = lVar14 + -8;
                lVar13 = lVar13 + 8;
              } while (8 < lVar14);
            }
          }
        }
        else {
          *(undefined8 *)pcVar4 = *(undefined8 *)(pcVar4 + -uVar9);
          *(undefined8 *)(pcVar4 + 8) = *(undefined8 *)(pcVar4 + (8 - uVar9));
        }
        writer->op_ = pcVar4 + uVar10;
        bVar5 = true;
        if ((long)this->ip_limit_ - (long)__src < 5) {
          this->ip_ = (char *)__src;
          bVar5 = RefillTag(this);
          if (bVar5) {
            __src = (uint *)this->ip_;
          }
        }
      }
      else {
LAB_00149dfc:
        bVar5 = false;
      }
      cVar6 = '\x01';
      if (bVar5 != false) {
LAB_00149f16:
        cVar6 = '\0';
      }
    }
    if ((cVar6 != '\0') && (cVar6 != '\x03')) {
      return;
    }
  } while( true );
}

Assistant:

void DecompressAllTags(Writer* writer) {
    const char* ip = ip_;

    // We could have put this refill fragment only at the beginning of the loop.
    // However, duplicating it at the end of each branch gives the compiler more
    // scope to optimize the <ip_limit_ - ip> expression based on the local
    // context, which overall increases speed.
    #define MAYBE_REFILL() \
        if (ip_limit_ - ip < kMaximumTagLength) { \
          ip_ = ip; \
          if (!RefillTag()) return; \
          ip = ip_; \
        }

    MAYBE_REFILL();
    for ( ;; ) {
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip++));

      if ((c & 0x3) == LITERAL) {
        size_t literal_length = (c >> 2) + 1u;
        if (writer->TryFastAppend(ip, ip_limit_ - ip, literal_length)) {
          assert(literal_length < 61);
          ip += literal_length;
          // NOTE(user): There is no MAYBE_REFILL() here, as TryFastAppend()
          // will not return true unless there's already at least five spare
          // bytes in addition to the literal.
          continue;
        }
        if (PREDICT_FALSE(literal_length >= 61)) {
          // Long literal.
          const size_t literal_length_length = literal_length - 60;
          literal_length =
              (LittleEndian::Load32(ip) & wordmask[literal_length_length]) + 1;
          ip += literal_length_length;
        }

        size_t avail = ip_limit_ - ip;
        while (avail < literal_length) {
          if (!writer->Append(ip, avail)) return;
          literal_length -= avail;
          reader_->Skip(peeked_);
          size_t n;
          ip = reader_->Peek(&n);
          avail = n;
          peeked_ = avail;
          if (avail == 0) return;  // Premature end of input
          ip_limit_ = ip + avail;
        }
        if (!writer->Append(ip, literal_length)) {
          return;
        }
        ip += literal_length;
        MAYBE_REFILL();
      } else {
        const uint32 entry = char_table[c];
        const uint32 trailer = LittleEndian::Load32(ip) & wordmask[entry >> 11];
        const uint32 length = entry & 0xff;
        ip += entry >> 11;

        // copy_offset/256 is encoded in bits 8..10.  By just fetching
        // those bits, we get copy_offset (since the bit-field starts at
        // bit 8).
        const uint32 copy_offset = entry & 0x700;
        if (!writer->AppendFromSelf(copy_offset + trailer, length)) {
          return;
        }
        MAYBE_REFILL();
      }
    }

#undef MAYBE_REFILL
  }